

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

void Abc_NtkSupportSum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint local_28;
  int local_24;
  int nTotalSupps;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  Abc_Ntk_t *pNtk_local;
  
  local_28 = 0;
  vSupp = (Vec_Ptr_t *)pNtk;
  for (local_24 = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp), local_24 < iVar1;
      local_24 = local_24 + 1) {
    _nTotalSupps = Abc_NtkCo((Abc_Ntk_t *)vSupp,local_24);
    pObj = (Abc_Obj_t *)Abc_NtkNodeSupport((Abc_Ntk_t *)vSupp,(Abc_Obj_t **)&nTotalSupps,1);
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj);
    local_28 = iVar1 + local_28;
    Vec_PtrFree((Vec_Ptr_t *)pObj);
  }
  printf("Total supports = %d.\n",(ulong)local_28);
  return;
}

Assistant:

void Abc_NtkSupportSum( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    int i, nTotalSupps = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        nTotalSupps += Vec_PtrSize( vSupp );
        Vec_PtrFree( vSupp );
    }
    printf( "Total supports = %d.\n", nTotalSupps );
}